

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_blur_geometry_device.cpp
# Opt level: O2

uint embree::addTriangleCube(RTCScene scene,Vec3fa *pos,uint num_time_steps)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  uint t;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar19 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  
  uVar9 = rtcNewGeometry(g_device,0);
  rtcSetGeometryTimeStepCount(uVar9,num_time_steps);
  rtcSetSharedGeometryBuffer(uVar9,0,0,0x5003,data._136_8_,0,0xc,0xc);
  for (uVar12 = 0; uVar8 = data._24_8_, uVar12 != num_time_steps; uVar12 = uVar12 + 1) {
    lVar10 = rtcSetNewGeometryBuffer(uVar9,1,uVar12,0x9003,0x10,8);
    fVar24 = ((float)uVar12 * 6.2831855) / (float)(num_time_steps - 1);
    auVar19._0_12_ = ZEXT812(0x3f800000);
    auVar19._12_4_ = 0;
    auVar19 = rsqrtss(auVar19,auVar19);
    fVar13 = auVar19._0_4_;
    fVar16 = fVar13 * fVar13 * fVar13 * -0.5 + fVar13 * 1.5;
    fVar17 = fVar16 * 0.0;
    fVar20 = fVar16 * 1.0;
    fVar16 = fVar16 * 0.0;
    fVar13 = sinf(fVar24);
    fVar24 = cosf(fVar24);
    fVar25 = (1.0 - fVar17 * fVar17) * fVar24 + fVar17 * fVar17;
    fVar14 = 1.0 - fVar24;
    fVar34 = fVar17 * fVar20 * fVar14;
    fVar18 = fVar34 - fVar13 * fVar16;
    fVar34 = fVar13 * fVar16 + fVar34;
    fVar35 = (1.0 - fVar20 * fVar20) * fVar24 + fVar20 * fVar20;
    fVar53 = fVar17 * fVar16 * fVar14;
    fVar14 = fVar20 * fVar16 * fVar14;
    fVar15 = fVar53 + fVar13 * fVar20;
    fVar53 = fVar53 - fVar13 * fVar20;
    fVar44 = fVar14 - fVar17 * fVar13;
    fVar14 = fVar17 * fVar13 + fVar14;
    fVar13 = (1.0 - fVar16 * fVar16) * fVar24 + fVar16 * fVar16;
    fVar26 = fVar25 * 1.0 + fVar34 * 0.0 + fVar53 * 0.0;
    fVar28 = fVar25 * 0.0 + fVar34 * 1.0 + fVar53 * 0.0;
    fVar30 = fVar25 * 0.0 + fVar34 * 0.0 + fVar53 * 1.0;
    fVar32 = fVar25 * 0.0 + fVar34 * 0.0 + fVar53 * 0.0;
    fVar53 = fVar18 * 1.0 + fVar35 * 0.0 + fVar14 * 0.0;
    fVar21 = fVar18 * 0.0 + fVar35 * 1.0 + fVar14 * 0.0;
    fVar22 = fVar18 * 0.0 + fVar35 * 0.0 + fVar14 * 1.0;
    fVar23 = fVar18 * 0.0 + fVar35 * 0.0 + fVar14 * 0.0;
    fVar24 = fVar15 * 1.0 + fVar44 * 0.0 + fVar13 * 0.0;
    fVar17 = fVar15 * 0.0 + fVar44 * 1.0 + fVar13 * 0.0;
    fVar20 = fVar15 * 0.0 + fVar44 * 0.0 + fVar13 * 1.0;
    fVar15 = fVar15 * 0.0 + fVar44 * 0.0 + fVar13 * 0.0;
    fVar36 = fVar24 * 0.0;
    fVar37 = fVar17 * 0.0;
    fVar38 = fVar20 * 0.0;
    fVar39 = fVar15 * 0.0;
    fVar13 = fVar53 * 0.0 + fVar36 + fVar26;
    fVar14 = fVar21 * 0.0 + fVar37 + fVar28;
    fVar16 = fVar22 * 0.0 + fVar38 + fVar30;
    fVar18 = fVar23 * 0.0 + fVar39 + fVar32;
    fVar26 = fVar26 * 0.0;
    fVar28 = fVar28 * 0.0;
    fVar30 = fVar30 * 0.0;
    fVar32 = fVar32 * 0.0;
    fVar40 = fVar53 + fVar36 + fVar26;
    fVar41 = fVar21 + fVar37 + fVar28;
    fVar42 = fVar22 + fVar38 + fVar30;
    fVar43 = fVar23 + fVar39 + fVar32;
    fVar25 = fVar24 + fVar53 * 0.0 + fVar26;
    fVar34 = fVar17 + fVar21 * 0.0 + fVar28;
    fVar35 = fVar20 + fVar22 * 0.0 + fVar30;
    fVar44 = fVar15 + fVar23 * 0.0 + fVar32;
    fVar27 = fVar25 * 0.0;
    fVar29 = fVar34 * 0.0;
    fVar31 = fVar35 * 0.0;
    fVar33 = fVar44 * 0.0;
    fVar45 = fVar40 * 0.0;
    fVar47 = fVar41 * 0.0;
    fVar49 = fVar42 * 0.0;
    fVar51 = fVar43 * 0.0;
    fVar46 = fVar45 + fVar27;
    fVar48 = fVar47 + fVar29;
    fVar50 = fVar49 + fVar31;
    fVar52 = fVar51 + fVar33;
    fVar24 = fVar13 * 0.0;
    fVar15 = fVar14 * 0.0;
    fVar17 = fVar16 * 0.0;
    fVar20 = fVar18 * 0.0;
    for (lVar11 = 0; lVar11 != 0x80; lVar11 = lVar11 + 0x10) {
      fVar2 = *(float *)((long)&cube_vertices + lVar11);
      fVar3 = *(float *)((long)&DAT_002ae034 + lVar11);
      fVar4 = *(float *)((long)&DAT_002ae038 + lVar11);
      fVar5 = (pos->field_0).m128[1];
      fVar6 = (pos->field_0).m128[2];
      fVar7 = (pos->field_0).m128[3];
      pfVar1 = (float *)(lVar10 + lVar11);
      *pfVar1 = fVar4 * (fVar25 + fVar45 + fVar24) +
                fVar24 + fVar46 + ((fVar53 * -0.0 - fVar36) - fVar26) + 0.0 +
                fVar3 * (fVar27 + fVar40 + fVar24) + fVar2 * (fVar13 + fVar13 + fVar46) +
                (pos->field_0).m128[0];
      pfVar1[1] = fVar4 * (fVar34 + fVar47 + fVar15) +
                  fVar15 + fVar48 + ((fVar21 * -0.0 - fVar37) - fVar28) + 0.0 +
                  fVar3 * (fVar29 + fVar41 + fVar15) + fVar2 * (fVar14 + fVar14 + fVar48) + fVar5;
      pfVar1[2] = fVar4 * (fVar35 + fVar49 + fVar17) +
                  fVar17 + fVar50 + ((fVar22 * -0.0 - fVar38) - fVar30) + 0.0 +
                  fVar3 * (fVar31 + fVar42 + fVar17) + fVar2 * (fVar16 + fVar16 + fVar50) + fVar6;
      pfVar1[3] = fVar4 * (fVar44 + fVar51 + fVar20) +
                  fVar20 + fVar52 + ((fVar23 * -0.0 - fVar39) - fVar32) + 0.0 +
                  fVar3 * (fVar33 + fVar43 + fVar20) + fVar2 * (fVar18 + fVar18 + fVar52) + fVar7;
    }
  }
  *(undefined8 *)data._24_8_ = 0x3f800000;
  *(undefined8 *)(uVar8 + 8) = 0;
  uVar8 = data._24_8_;
  *(undefined8 *)(data._24_8_ + 0x10) = 0x3f800000;
  *(undefined8 *)(uVar8 + 0x18) = 0;
  uVar8 = data._24_8_;
  *(undefined8 *)(data._24_8_ + 0x20) = 0x3f80000000000000;
  *(undefined8 *)(uVar8 + 0x28) = 0;
  *(undefined8 *)(uVar8 + 0x30) = 0x3f80000000000000;
  *(undefined8 *)(uVar8 + 0x38) = 0;
  *(undefined8 *)(uVar8 + 0x40) = 0x3f0000003f000000;
  *(undefined8 *)(uVar8 + 0x48) = 0x3f0000003f000000;
  *(undefined8 *)(uVar8 + 0x50) = 0x3f0000003f000000;
  *(undefined8 *)(uVar8 + 0x58) = 0x3f0000003f000000;
  *(undefined8 *)(uVar8 + 0x60) = 0x3f8000003f800000;
  *(undefined8 *)(uVar8 + 0x68) = 0x3f8000003f800000;
  *(undefined8 *)(uVar8 + 0x70) = 0x3f8000003f800000;
  *(undefined8 *)(uVar8 + 0x78) = 0x3f8000003f800000;
  *(undefined8 *)(uVar8 + 0x80) = 0;
  *(undefined8 *)(uVar8 + 0x88) = 0x3f800000;
  *(undefined8 *)(uVar8 + 0x90) = 0;
  *(undefined8 *)(uVar8 + 0x98) = 0x3f800000;
  *(undefined8 *)(uVar8 + 0xa0) = 0x3f8000003f800000;
  *(undefined8 *)(uVar8 + 0xa8) = 0;
  *(undefined8 *)(uVar8 + 0xb0) = 0x3f8000003f800000;
  *(undefined8 *)(uVar8 + 0xb8) = 0;
  rtcCommitGeometry(uVar9);
  uVar12 = rtcAttachGeometry(scene,uVar9);
  rtcReleaseGeometry(uVar9);
  return uVar12;
}

Assistant:

unsigned int addTriangleCube (RTCScene scene, const Vec3fa& pos, unsigned int num_time_steps)
{
  /* create a triangulated cube with 12 triangles and 8 vertices */
  RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);
  rtcSetGeometryTimeStepCount(geom,num_time_steps);
  rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX, 0, RTC_FORMAT_UINT3, data.cube_triangle_indices, 0, 3*sizeof(unsigned int), 12);

  for (unsigned int t=0; t<num_time_steps; t++)
  {
    RTCBufferType bufType = RTC_BUFFER_TYPE_VERTEX;
    Vec3fa* vertices = (Vec3fa*) rtcSetNewGeometryBuffer(geom,bufType,t,RTC_FORMAT_FLOAT3,sizeof(Vec3fa), 8);

    AffineSpace3fa rotation = AffineSpace3fa::rotate(Vec3fa(0,0,0),Vec3fa(0,1,0),2.0f*float(M_PI)*(float)t/(float)(num_time_steps-1));
    AffineSpace3fa scale = AffineSpace3fa::scale(Vec3fa(2.0f,1.0f,1.0f));

    for (int i=0; i<8; i++) {
      Vec3fa v = Vec3fa(cube_vertices[i][0],cube_vertices[i][1],cube_vertices[i][2]);
      vertices[i] = Vec3fa(xfmPoint(rotation*scale,v)+pos);
    }
  }

  /* create face color array */
  data.face_colors[0] = Vec3fa(1,0,0);
  data.face_colors[1] = Vec3fa(1,0,0);
  data.face_colors[2] = Vec3fa(0,1,0);
  data.face_colors[3] = Vec3fa(0,1,0);
  data.face_colors[4] = Vec3fa(0.5f);
  data.face_colors[5] = Vec3fa(0.5f);
  data.face_colors[6] = Vec3fa(1.0f);
  data.face_colors[7] = Vec3fa(1.0f);
  data.face_colors[8] = Vec3fa(0,0,1);
  data.face_colors[9] = Vec3fa(0,0,1);
  data.face_colors[10] = Vec3fa(1,1,0);
  data.face_colors[11] = Vec3fa(1,1,0);

  rtcCommitGeometry(geom);
  unsigned int geomID = rtcAttachGeometry(scene,geom);
  rtcReleaseGeometry(geom);
  return geomID;
}